

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O1

bool __thiscall ninx::lexer::Reader::ignore_comment(Reader *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  
  iVar4 = std::istream::peek();
  if (iVar4 == 0x2f) {
    std::istream::get();
    iVar4 = std::istream::peek();
    if (iVar4 == 0x2a) {
      std::istream::get();
      bVar3 = false;
      do {
        bVar1 = bVar3;
        if (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) != 0) break;
        iVar4 = std::istream::get();
        bVar2 = bVar1;
        if (iVar4 == 0x2a) {
          bVar2 = true;
        }
        bVar3 = false;
        if (iVar4 == 0x2f) {
          bVar3 = bVar1;
        }
        if (!bVar1) {
          bVar3 = bVar2;
        }
      } while ((iVar4 != 0x2f) || (!bVar1));
      ignore_spaces_and_newline(this,-1);
      return true;
    }
    std::istream::seekg((long)this->stream,~_S_beg);
  }
  return false;
}

Assistant:

bool ninx::lexer::Reader::ignore_comment() {
    // Verify that this is a comment
    if (this->stream.peek() != '/') {
        return false;  // Not a comment
    }

    this->stream.get();

    if (this->stream.peek() != '*') {
        this->stream.seekg(-1, std::ios_base::cur);  // Rewind the / character
        return false;
    }

    this->stream.get();

    bool is_closing {false};

    while (stream) {
        int current {stream.get()};

        if (is_closing) {
            if (current == '/') {
                break;
            }else{
                is_closing = false;
            }
        }else{
            if (current == '*') {
                is_closing = true;
            }
        }
    }

    // Eat all the following spaces
    this->ignore_spaces_and_newline();

    return true;
}